

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  pointer pVVar2;
  pointer pVVar3;
  string_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar7;
  bool bVar8;
  reference pvVar9;
  DataChunk *this;
  idx_t iVar10;
  ulong uVar11;
  string_t *psVar12;
  ulong uVar13;
  size_type sVar14;
  VectorType vector_type_p;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  Vector *local_890;
  ExpressionState *local_888;
  UnifiedVectorFormat local_880;
  optional_ptr<duckdb::FunctionLocalState,_true> local_838 [257];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar9);
    return;
  }
  this = SortKeyLeastGreatest::Prepare(args,state);
  local_838[0].ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  local_888 = state;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(local_838);
  oVar7.ptr = local_838[0].ptr;
  if ((this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    switchD_012e5a64::default(local_838,0,0x800);
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar14 = 0;
    local_890 = result;
    do {
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar14);
      if (pvVar9->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar14 = sVar14 + 1;
      pVVar2 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (sVar14 < (ulong)(((long)pVVar3 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
    psVar4 = (string_t *)oVar7.ptr[0xd]._vptr_FunctionLocalState;
    switchD_012e5a64::default(local_838,0,0x800);
    result = local_890;
    if (pVVar3 != pVVar2) {
      sVar14 = 0;
      do {
        pvVar9 = vector<duckdb::Vector,_true>::operator[](&this->data,sVar14);
        if (pvVar9->vector_type == CONSTANT_VECTOR) {
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&this->data,sVar14);
          puVar5 = (pvVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) goto LAB_01b91316;
        }
        else {
LAB_01b91316:
          UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&this->data,sVar14);
          Vector::ToUnifiedFormat(pvVar9,this->count,&local_880);
          pdVar6 = local_880.data;
          iVar10 = this->count;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar10 != 0) {
              uVar13 = 0;
              psVar12 = psVar4;
              do {
                uVar11 = uVar13;
                if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                  uVar11 = (ulong)(local_880.sel)->sel_vector[uVar13];
                }
                pdVar1 = pdVar6 + uVar11 * 0x10;
                local_8a8._0_8_ = *(undefined8 *)pdVar1;
                local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
                if ((*(char *)((long)&local_838[0].ptr + uVar13) != '\x01') ||
                   (bVar8 = string_t::StringComparisonOperators::GreaterThan
                                      ((string_t *)&local_8a8.pointer,psVar12), bVar8)) {
                  *(undefined1 *)((long)&local_838[0].ptr + uVar13) = 1;
                  *(undefined8 *)&psVar12->value = local_8a8._0_8_;
                  (psVar12->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                uVar13 = uVar13 + 1;
                psVar12 = psVar12 + 1;
              } while (uVar13 < this->count);
            }
          }
          else if (iVar10 != 0) {
            uVar13 = 0;
            psVar12 = psVar4;
            do {
              uVar11 = uVar13;
              if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                uVar11 = (ulong)(local_880.sel)->sel_vector[uVar13];
              }
              if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0) ||
                 ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
                pdVar1 = pdVar6 + uVar11 * 0x10;
                local_8a8._0_8_ = *(undefined8 *)pdVar1;
                local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
                if ((*(char *)((long)&local_838[0].ptr + uVar13) != '\x01') ||
                   (bVar8 = string_t::StringComparisonOperators::GreaterThan
                                      ((string_t *)&local_8a8.pointer,psVar12), bVar8)) {
                  *(undefined1 *)((long)&local_838[0].ptr + uVar13) = 1;
                  *(undefined8 *)&psVar12->value = local_8a8._0_8_;
                  (psVar12->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                iVar10 = this->count;
              }
              uVar13 = uVar13 + 1;
              psVar12 = psVar12 + 1;
            } while (uVar13 < iVar10);
          }
          if (local_880.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        sVar14 = sVar14 + 1;
        result = local_890;
      } while (sVar14 < (ulong)(((long)(this->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
  }
  SortKeyLeastGreatest::FinalizeResult(this->count,(bool *)local_838,result,local_888);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}